

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

void __thiscall Num3072::Multiply(Num3072 *this,Num3072 *a)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  limb_t lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int j;
  long lVar13;
  ulong uVar14;
  limb_t lVar15;
  long lVar16;
  long lVar17;
  limb_t *plVar18;
  limb_t *plVar19;
  limb_t *b;
  long in_FS_OFFSET;
  bool bVar20;
  long local_238;
  limb_t d2;
  limb_t local_1e0;
  limb_t local_1d8;
  limb_t local_1d0;
  limb_t local_1c8;
  limb_t local_1c0;
  Num3072 tmp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c0 = 0;
  local_1c8 = 0;
  local_1d0 = 0;
  SetToOne(&tmp);
  auVar7._8_8_ = local_1e0;
  auVar7._0_8_ = local_1d8;
  uVar11 = a->limbs[0x2f];
  plVar18 = this->limbs + 2;
  lVar13 = 0x2e;
  local_238 = 0;
  lVar9 = 0;
  uVar12 = 0;
  lVar17 = 0;
  while (lVar17 != 0x2f) {
    d2 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar11;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->limbs[lVar17 + 1];
    auVar7 = auVar2 * auVar3;
    lVar16 = lVar13;
    plVar19 = plVar18;
    b = a->limbs + 0x2e;
    while (local_1e0 = auVar7._8_8_, local_1d8 = auVar7._0_8_, bVar20 = lVar16 != 0,
          lVar16 = lVar16 + -1, bVar20) {
      anon_unknown.dwarf_23ed29f::muladd3(&local_1d8,&local_1e0,&d2,plVar19,b);
      auVar7._8_8_ = local_1e0;
      auVar7._0_8_ = local_1d8;
      b = b + -1;
      plVar19 = plVar19 + 1;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_1d8;
    uVar14 = SUB168(ZEXT816(0x10d765) * auVar4,8);
    uVar10 = SUB168(ZEXT816(0x10d765) * auVar4,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_1e0;
    local_1c0 = uVar10 + uVar12;
    uVar12 = (ulong)CARRY8(uVar10,uVar12);
    uVar10 = lVar9 + uVar14;
    auVar8[8] = CARRY8(lVar9,uVar14) || CARRY8(uVar10,uVar12);
    auVar8._0_8_ = uVar10 + uVar12;
    auVar8._9_7_ = 0;
    auVar8 = ZEXT816(0x10d765) * auVar5 + auVar8;
    local_1c8 = auVar8._0_8_;
    local_1d0 = d2 * 0x10d765 + auVar8._8_8_;
    plVar19 = this->limbs;
    for (lVar16 = local_238; lVar9 = local_1d0, local_1e0 = auVar7._8_8_, local_1d8 = auVar7._0_8_,
        lVar16 != -8; lVar16 = lVar16 + -8) {
      anon_unknown.dwarf_23ed29f::muladd3
                (&local_1c0,&local_1c8,&local_1d0,plVar19,(limb_t *)((long)a->limbs + lVar16));
      auVar7._8_8_ = local_1e0;
      auVar7._0_8_ = local_1d8;
      plVar19 = plVar19 + 1;
    }
    tmp.limbs[lVar17] = local_1c0;
    local_1c0 = local_1c8;
    uVar10 = local_1d0;
    local_1d0 = 0;
    lVar13 = lVar13 + -1;
    plVar18 = plVar18 + 1;
    local_238 = local_238 + 8;
    uVar12 = local_1c8;
    lVar17 = lVar17 + 1;
    local_1c8 = uVar10;
  }
  plVar18 = a->limbs + 0x2f;
  for (lVar13 = 0; local_1e0 = auVar7._8_8_, local_1d8 = auVar7._0_8_, lVar13 != 0x180;
      lVar13 = lVar13 + 8) {
    anon_unknown.dwarf_23ed29f::muladd3
              (&local_1c0,&local_1c8,&local_1d0,(limb_t *)((long)this->limbs + lVar13),plVar18);
    auVar7._8_8_ = local_1e0;
    auVar7._0_8_ = local_1d8;
    plVar18 = plVar18 + -1;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1c8;
  uVar11 = SUB168(ZEXT816(0x10d765) * auVar6,0);
  tmp.limbs[0x2f] = local_1c0;
  uVar12 = local_1d0 * 0x10d765 + SUB168(ZEXT816(0x10d765) * auVar6,8);
  for (lVar13 = 0; lVar13 != 0x30; lVar13 = lVar13 + 1) {
    bVar20 = CARRY8(uVar11,tmp.limbs[lVar13]);
    lVar15 = uVar11 + tmp.limbs[lVar13];
    uVar11 = uVar12 + 1;
    if (!bVar20) {
      uVar11 = uVar12;
    }
    uVar12 = (ulong)(bVar20 && uVar12 + 1 == 0);
    this->limbs[lVar13] = lVar15;
  }
  if (uVar12 == 0) {
    if (1 < uVar11) {
      __assert_fail("c0 == 0 || c0 == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/muhash.cpp"
                    ,0xd0,"void Num3072::Multiply(const Num3072 &)");
    }
    bVar20 = IsOverflow(this);
    if (bVar20) {
      FullReduce(this);
    }
    if (uVar11 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      FullReduce(this);
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("c1 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/muhash.cpp"
                ,0xcf,"void Num3072::Multiply(const Num3072 &)");
}

Assistant:

void Num3072::Multiply(const Num3072& a)
{
    limb_t c0 = 0, c1 = 0, c2 = 0;
    Num3072 tmp;

    /* Compute limbs 0..N-2 of this*a into tmp, including one reduction. */
    for (int j = 0; j < LIMBS - 1; ++j) {
        limb_t d0 = 0, d1 = 0, d2 = 0;
        mul(d0, d1, this->limbs[1 + j], a.limbs[LIMBS + j - (1 + j)]);
        for (int i = 2 + j; i < LIMBS; ++i) muladd3(d0, d1, d2, this->limbs[i], a.limbs[LIMBS + j - i]);
        mulnadd3(c0, c1, c2, d0, d1, d2, MAX_PRIME_DIFF);
        for (int i = 0; i < j + 1; ++i) muladd3(c0, c1, c2, this->limbs[i], a.limbs[j - i]);
        extract3(c0, c1, c2, tmp.limbs[j]);
    }

    /* Compute limb N-1 of a*b into tmp. */
    assert(c2 == 0);
    for (int i = 0; i < LIMBS; ++i) muladd3(c0, c1, c2, this->limbs[i], a.limbs[LIMBS - 1 - i]);
    extract3(c0, c1, c2, tmp.limbs[LIMBS - 1]);

    /* Perform a second reduction. */
    muln2(c0, c1, MAX_PRIME_DIFF);
    for (int j = 0; j < LIMBS; ++j) {
        addnextract2(c0, c1, tmp.limbs[j], this->limbs[j]);
    }

    assert(c1 == 0);
    assert(c0 == 0 || c0 == 1);

    /* Perform up to two more reductions if the internal state has already
     * overflown the MAX of Num3072 or if it is larger than the modulus or
     * if both are the case.
     * */
    if (this->IsOverflow()) this->FullReduce();
    if (c0) this->FullReduce();
}